

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t spvtools::val::PerformCfgChecks(ValidationState_t *_)

{
  uint32_t uVar1;
  pointer ppBVar2;
  char *pcVar3;
  undefined1 auVar4 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  spv_result_t sVar10;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar11;
  size_t sVar12;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar13;
  BasicBlock *pBVar14;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  _Var15;
  Instruction *pIVar16;
  pointer ppBVar17;
  _Alloc_hider _Var18;
  BasicBlock *pBVar19;
  _Hash_node_base *p_Var20;
  pointer this;
  string undef_blocks;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  postorder;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  edges_1;
  BasicBlock *idom;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  edges;
  spv_result_t local_514;
  string local_508;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  local_4e8;
  string local_4d0;
  EnumSet<spv::Capability> *local_4b0;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  local_4a8;
  pointer local_490;
  _Any_data local_488;
  code *local_478;
  code *local_470;
  _Any_data local_468;
  code *local_458;
  code *local_450;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  _Any_data local_428;
  code *local_418;
  code *local_410;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  _Any_data local_368;
  code *local_358;
  code *local_350;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  _Any_data local_2c8;
  code *local_2b8;
  _Any_data local_2a8;
  code *local_298;
  _Any_data local_288;
  code *local_278;
  _Any_data local_268;
  code *local_258;
  _Any_data local_248;
  code *local_238;
  _Any_data local_228;
  code *local_218;
  undefined1 local_208 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  spv_result_t local_38;
  
  pvVar11 = ValidationState_t::functions(_);
  this = (pvVar11->
         super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>).
         _M_impl.super__Vector_impl_data._M_start;
  local_490 = (pvVar11->
              super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
  if (this != local_490) {
    local_4b0 = &_->module_capabilities_;
    do {
      sVar12 = Function::undefined_block_count(this);
      if (sVar12 != 0) {
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"{","");
        p_Var20 = (this->undefined_blocks_)._M_h._M_before_begin._M_nxt;
        if (p_Var20 != (_Hash_node_base *)0x0) {
          bVar7 = true;
          do {
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)local_208,_,*(uint32_t *)&p_Var20[1]._M_nxt);
            std::__cxx11::string::_M_append((char *)&local_508,(ulong)local_208);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,(ulong)(local_1f8[0]._M_allocated_capacity + 1));
            }
            if (!bVar7) {
              std::__cxx11::string::append((char *)&local_508);
            }
            p_Var20 = p_Var20->_M_nxt;
            bVar7 = false;
          } while (p_Var20 != (_Hash_node_base *)0x0);
        }
        pIVar16 = ValidationState_t::FindDef(_,this->id_);
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_CFG,pIVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Block(s) ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_508._M_dataplus._M_p,local_508._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," are referenced but not defined in function ",0x2c);
        ValidationState_t::getIdName_abi_cxx11_(&local_4d0,_,this->id_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p == &local_508.field_2) {
          return local_38;
        }
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        return local_38;
      }
      local_4e8.
      super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_4e8.
      super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4e8.
      super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar13 = Function::ordered_blocks(this);
      if ((pvVar13->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (pvVar13->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pBVar14 = Function::first_block(this);
        Function::AugmentedCFGSuccessorsFunction(this);
        local_368._M_unused._M_object = (void *)0x0;
        local_368._8_8_ = 0;
        local_350 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_invoke;
        local_358 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_manager;
        local_428._8_8_ = 0;
        local_428._M_unused._M_object = &local_4e8;
        local_410 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1009:25)>
                    ::_M_invoke;
        local_418 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1009:25)>
                    ::_M_manager;
        local_388._M_unused._M_object = (void *)0x0;
        local_388._8_8_ = 0;
        local_370 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_invoke;
        local_378 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_manager;
        CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                  (pBVar14,(get_blocks_func *)&local_288,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_368,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_428,
                   (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_388);
        if (local_378 != (code *)0x0) {
          (*local_378)(&local_388,&local_388,__destroy_functor);
        }
        if (local_418 != (code *)0x0) {
          (*local_418)(&local_428,&local_428,__destroy_functor);
        }
        if (local_358 != (code *)0x0) {
          (*local_358)(&local_368,&local_368,__destroy_functor);
        }
        if (local_278 != (code *)0x0) {
          (*local_278)(&local_288,&local_288,__destroy_functor);
        }
        Function::AugmentedCFGPredecessorsFunction(this);
        CFA<spvtools::val::BasicBlock>::CalculateDominators
                  ((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    *)local_208,&local_4e8,(get_blocks_func *)&local_228);
        auVar4 = local_208;
        paVar5 = paStack_200;
        if (local_218 != (code *)0x0) {
          (*local_218)(&local_228,&local_228,__destroy_functor);
          auVar4 = local_208;
          paVar5 = paStack_200;
        }
        for (; paVar6 = paStack_200, auVar4 != (undefined1  [8])paStack_200;
            auVar4 = (undefined1  [8])((long)auVar4 + 0x10)) {
          paStack_200 = paVar5;
          if (*(BasicBlock **)auVar4 != *(BasicBlock **)((long)auVar4 + 8)) {
            BasicBlock::SetImmediateDominator
                      (*(BasicBlock **)auVar4,*(BasicBlock **)((long)auVar4 + 8));
          }
          paVar5 = paStack_200;
          paStack_200 = paVar6;
        }
        paStack_200 = paVar5;
        if (local_208 != (undefined1  [8])0x0) {
          operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity - (long)local_208);
        }
      }
      pvVar13 = Function::ordered_blocks(this);
      ppBVar17 = (pvVar13->
                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppBVar2 = (pvVar13->
                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (ppBVar17 != ppBVar2) {
        ppBVar17 = ppBVar17 + 1;
        if (ppBVar17 != ppBVar2) {
          do {
            local_4a8.
            super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)BasicBlock::immediate_dominator(*ppBVar17);
            if (((BasicBlock *)
                 local_4a8.
                 super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != &this->pseudo_entry_block_ &&
                 (BasicBlock *)
                 local_4a8.
                 super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != (BasicBlock *)0x0) &&
               (_Var15 = std::
                         __find_if<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock**,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::BasicBlock*const>>
                                   ((pvVar13->
                                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start,ppBVar17,&local_4a8),
               ppBVar17 == _Var15._M_current)) {
              pIVar16 = ValidationState_t::FindDef
                                  (_,*(uint32_t *)
                                      &(local_4a8.
                                        super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first);
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_CFG,pIVar16)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Block ",6);
              ValidationState_t::getIdName_abi_cxx11_(&local_508,_,(*ppBVar17)->id_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_508._M_dataplus._M_p,local_508._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," appears in the binary before its dominator ",0x2c);
              ValidationState_t::getIdName_abi_cxx11_
                        (&local_4d0,_,
                         *(uint32_t *)
                          &(local_4a8.
                            super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_4d0._M_dataplus._M_p,local_4d0._M_string_length)
              ;
              local_514 = local_38;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                operator_delete(local_4d0._M_dataplus._M_p,
                                local_4d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              goto LAB_0015b983;
            }
            ppBVar17 = ppBVar17 + 1;
          } while (ppBVar17 !=
                   (pvVar13->
                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        }
        bVar7 = EnumSet<spv::Capability>::contains(local_4b0,CapabilityShader);
        if ((bVar7) &&
           (ppBVar17 = (pvVar13->
                       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                       )._M_impl.super__Vector_impl_data._M_start,
           ppBVar17 !=
           (pvVar13->
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           )._M_impl.super__Vector_impl_data._M_finish)) {
          uVar1 = (_->options_->universal_limits_).max_control_flow_nesting_depth;
LAB_0015b26a:
          iVar9 = Function::GetBlockDepth(this,*ppBVar17);
          if (iVar9 <= (int)uVar1) goto code_r0x0015b27e;
          pIVar16 = ValidationState_t::FindDef(_,(*ppBVar17)->id_);
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_CFG,pIVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Maximum Control Flow nesting depth exceeded.",0x2c);
          local_514 = local_38;
LAB_0015b983:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar7 = false;
          goto LAB_0015b98a;
        }
      }
LAB_0015b288:
      bVar8 = EnumSet<spv::Capability>::contains(local_4b0,CapabilityShader);
      bVar7 = true;
      if (bVar8) {
        if (local_4e8.
            super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_4e8.
            super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_4e8.
          super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_4e8.
               super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        local_208 = (undefined1  [8])0x0;
        paStack_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_1f8[0]._M_allocated_capacity = (pointer)0x0;
        local_508.field_2._M_allocated_capacity = 0;
        local_508._M_dataplus._M_p = (pointer)0x0;
        local_508._M_string_length = 0;
        pvVar13 = Function::ordered_blocks(this);
        if ((pvVar13->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar13->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          pBVar14 = Function::first_block(this);
          Function::AugmentedStructuralCFGSuccessorsFunction(this);
          local_3a8._M_unused._M_object = (void *)0x0;
          local_3a8._8_8_ = 0;
          local_390 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_invoke;
          local_398 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_manager;
          local_448._8_8_ = 0;
          local_448._M_unused._M_object = &local_4e8;
          local_430 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1060:13)>
                      ::_M_invoke;
          local_438 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1060:13)>
                      ::_M_manager;
          local_308._M_unused._M_object = (void *)0x0;
          local_308._8_8_ = 0;
          local_2f0 = std::
                      _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                      ::_M_invoke;
          local_2f8 = std::
                      _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                      ::_M_manager;
          CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                    (pBVar14,(get_blocks_func *)&local_2a8,
                     (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_3a8,
                     (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_448,
                     (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_308);
          if (local_2f8 != (code *)0x0) {
            (*local_2f8)(&local_308,&local_308,__destroy_functor);
          }
          if (local_438 != (code *)0x0) {
            (*local_438)(&local_448,&local_448,__destroy_functor);
          }
          if (local_398 != (code *)0x0) {
            (*local_398)(&local_3a8,&local_3a8,__destroy_functor);
          }
          if (local_298 != (code *)0x0) {
            (*local_298)(&local_2a8,&local_2a8,__destroy_functor);
          }
          Function::AugmentedStructuralCFGPredecessorsFunction(this);
          CFA<spvtools::val::BasicBlock>::CalculateDominators
                    ((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                      *)&local_4d0,&local_4e8,(get_blocks_func *)&local_248);
          _Var18._M_p = local_4d0._M_dataplus._M_p;
          pcVar3 = (char *)local_4d0._M_string_length;
          if (local_238 != (code *)0x0) {
            (*local_238)(&local_248,&local_248,__destroy_functor);
            _Var18._M_p = local_4d0._M_dataplus._M_p;
            pcVar3 = (char *)local_4d0._M_string_length;
          }
          for (; _Var18._M_p != pcVar3; _Var18._M_p = _Var18._M_p + 0x10) {
            if (*(BasicBlock **)_Var18._M_p != *(BasicBlock **)(_Var18._M_p + 8)) {
              BasicBlock::SetImmediateStructuralDominator
                        (*(BasicBlock **)_Var18._M_p,*(BasicBlock **)(_Var18._M_p + 8));
            }
          }
          Function::AugmentedStructuralCFGPredecessorsFunction(this);
          local_3c8._M_unused._M_object = (void *)0x0;
          local_3c8._8_8_ = 0;
          local_3b0 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_invoke;
          local_3b8 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_manager;
          local_468._8_8_ = 0;
          local_468._M_unused._M_object = local_208;
          local_450 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1073:13)>
                      ::_M_invoke;
          local_458 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1073:13)>
                      ::_M_manager;
          local_328._M_unused._M_object = (void *)0x0;
          local_328._8_8_ = 0;
          local_310 = std::
                      _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                      ::_M_invoke;
          local_318 = std::
                      _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                      ::_M_manager;
          CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                    (&this->pseudo_exit_block_,(get_blocks_func *)&local_2c8,
                     (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_3c8,
                     (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_468,
                     (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_328);
          if (local_318 != (code *)0x0) {
            (*local_318)(&local_328,&local_328,__destroy_functor);
          }
          if (local_458 != (code *)0x0) {
            (*local_458)(&local_468,&local_468,__destroy_functor);
          }
          if (local_3b8 != (code *)0x0) {
            (*local_3b8)(&local_3c8,&local_3c8,__destroy_functor);
          }
          if (local_2b8 != (code *)0x0) {
            (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
          }
          Function::AugmentedStructuralCFGSuccessorsFunction(this);
          CFA<spvtools::val::BasicBlock>::CalculateDominators
                    (&local_4a8,
                     (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                      *)local_208,(get_blocks_func *)&local_268);
          pBVar19 = (BasicBlock *)
                    local_4a8.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar14 = (BasicBlock *)
                    local_4a8.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (local_258 != (code *)0x0) {
            (*local_258)(&local_268,&local_268,__destroy_functor);
            pBVar19 = (BasicBlock *)
                      local_4a8.
                      super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pBVar14 = (BasicBlock *)
                      local_4a8.
                      super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; pBVar19 != pBVar14;
              pBVar19 = (BasicBlock *)&pBVar19->immediate_structural_dominator_) {
            BasicBlock::SetImmediateStructuralPostDominator
                      (*(BasicBlock **)pBVar19,pBVar19->immediate_dominator_);
          }
          Function::AugmentedStructuralCFGSuccessorsFunction(this);
          local_3e8._M_unused._M_object = (void *)0x0;
          local_3e8._8_8_ = 0;
          local_3d0 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_invoke;
          local_3d8 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_manager;
          local_408._M_unused._M_object = (void *)0x0;
          local_408._8_8_ = 0;
          local_3f0 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_invoke;
          local_3f8 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                      ::_M_manager;
          local_488._8_8_ = 0;
          local_488._M_unused._M_object = &local_508;
          local_470 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1086:13)>
                      ::_M_invoke;
          local_478 = std::
                      _Function_handler<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1086:13)>
                      ::_M_manager;
          local_348._M_unused._M_object = (void *)0x0;
          local_348._8_8_ = 0;
          local_330 = std::
                      _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                      ::_M_invoke;
          local_338 = std::
                      _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                      ::_M_manager;
          CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                    (&this->pseudo_entry_block_,(get_blocks_func *)&local_2e8,
                     (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_3e8,
                     (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_408,
                     (function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>
                      *)&local_488,(function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_348)
          ;
          if (local_338 != (code *)0x0) {
            (*local_338)(&local_348,&local_348,__destroy_functor);
          }
          if (local_478 != (code *)0x0) {
            (*local_478)(&local_488,&local_488,__destroy_functor);
          }
          if (local_3f8 != (code *)0x0) {
            (*local_3f8)(&local_408,&local_408,__destroy_functor);
          }
          if (local_3d8 != (code *)0x0) {
            (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
          }
          if (local_2d8 != (code *)0x0) {
            (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
          }
          if ((BasicBlock *)
              local_4a8.
              super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (BasicBlock *)0x0) {
            operator_delete(local_4a8.
                            super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_4a8.
                                  super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_4a8.
                                  super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_4d0._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_4d0._M_dataplus._M_p,
                            local_4d0.field_2._M_allocated_capacity -
                            (long)local_4d0._M_dataplus._M_p);
          }
        }
        UpdateContinueConstructExitBlocks
                  (this,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&local_508);
        sVar10 = StructuredControlFlowChecks
                           (_,this,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    *)&local_508,&local_4e8);
        bVar7 = sVar10 == SPV_SUCCESS;
        if (!bVar7) {
          local_514 = sVar10;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_508._M_dataplus._M_p,
                          local_508.field_2._M_allocated_capacity - (long)local_508._M_dataplus._M_p
                         );
        }
        if (local_208 != (undefined1  [8])0x0) {
          operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity - (long)local_208);
        }
      }
LAB_0015b98a:
      if (local_4e8.
          super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4e8.
                        super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4e8.
                              super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4e8.
                              super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (!bVar7) {
        return local_514;
      }
      this = this + 1;
    } while (this != local_490);
  }
  sVar10 = MaximalReconvergenceChecks(_);
  return sVar10;
code_r0x0015b27e:
  ppBVar17 = ppBVar17 + 1;
  if (ppBVar17 ==
      (pvVar13->
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0015b288;
  goto LAB_0015b26a;
}

Assistant:

spv_result_t PerformCfgChecks(ValidationState_t& _) {
  for (auto& function : _.functions()) {
    // Check all referenced blocks are defined within a function
    if (function.undefined_block_count() != 0) {
      std::string undef_blocks("{");
      bool first = true;
      for (auto undefined_block : function.undefined_blocks()) {
        undef_blocks += _.getIdName(undefined_block);
        if (!first) {
          undef_blocks += " ";
        }
        first = false;
      }
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(function.id()))
             << "Block(s) " << undef_blocks << "}"
             << " are referenced but not defined in function "
             << _.getIdName(function.id());
    }

    // Set each block's immediate dominator.
    //
    // We want to analyze all the blocks in the function, even in degenerate
    // control flow cases including unreachable blocks.  So use the augmented
    // CFG to ensure we cover all the blocks.
    std::vector<const BasicBlock*> postorder;
    auto ignore_block = [](const BasicBlock*) {};
    auto no_terminal_blocks = [](const BasicBlock*) { return false; };
    if (!function.ordered_blocks().empty()) {
      /// calculate dominators
      CFA<BasicBlock>::DepthFirstTraversal(
          function.first_block(), function.AugmentedCFGSuccessorsFunction(),
          ignore_block, [&](const BasicBlock* b) { postorder.push_back(b); },
          no_terminal_blocks);
      auto edges = CFA<BasicBlock>::CalculateDominators(
          postorder, function.AugmentedCFGPredecessorsFunction());
      for (auto edge : edges) {
        if (edge.first != edge.second)
          edge.first->SetImmediateDominator(edge.second);
      }
    }

    auto& blocks = function.ordered_blocks();
    if (!blocks.empty()) {
      // Check if the order of blocks in the binary appear before the blocks
      // they dominate
      for (auto block = begin(blocks) + 1; block != end(blocks); ++block) {
        if (auto idom = (*block)->immediate_dominator()) {
          if (idom != function.pseudo_entry_block() &&
              block == std::find(begin(blocks), block, idom)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(idom->id()))
                   << "Block " << _.getIdName((*block)->id())
                   << " appears in the binary before its dominator "
                   << _.getIdName(idom->id());
          }
        }
      }
      // If we have structured control flow, check that no block has a control
      // flow nesting depth larger than the limit.
      if (_.HasCapability(spv::Capability::Shader)) {
        const int control_flow_nesting_depth_limit =
            _.options()->universal_limits_.max_control_flow_nesting_depth;
        for (auto block = begin(blocks); block != end(blocks); ++block) {
          if (function.GetBlockDepth(*block) >
              control_flow_nesting_depth_limit) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef((*block)->id()))
                   << "Maximum Control Flow nesting depth exceeded.";
          }
        }
      }
    }

    /// Structured control flow checks are only required for shader capabilities
    if (_.HasCapability(spv::Capability::Shader)) {
      // Calculate structural dominance.
      postorder.clear();
      std::vector<const BasicBlock*> postdom_postorder;
      std::vector<std::pair<uint32_t, uint32_t>> back_edges;
      if (!function.ordered_blocks().empty()) {
        /// calculate dominators
        CFA<BasicBlock>::DepthFirstTraversal(
            function.first_block(),
            function.AugmentedStructuralCFGSuccessorsFunction(), ignore_block,
            [&](const BasicBlock* b) { postorder.push_back(b); },
            no_terminal_blocks);
        auto edges = CFA<BasicBlock>::CalculateDominators(
            postorder, function.AugmentedStructuralCFGPredecessorsFunction());
        for (auto edge : edges) {
          if (edge.first != edge.second)
            edge.first->SetImmediateStructuralDominator(edge.second);
        }

        /// calculate post dominators
        CFA<BasicBlock>::DepthFirstTraversal(
            function.pseudo_exit_block(),
            function.AugmentedStructuralCFGPredecessorsFunction(), ignore_block,
            [&](const BasicBlock* b) { postdom_postorder.push_back(b); },
            no_terminal_blocks);
        auto postdom_edges = CFA<BasicBlock>::CalculateDominators(
            postdom_postorder,
            function.AugmentedStructuralCFGSuccessorsFunction());
        for (auto edge : postdom_edges) {
          edge.first->SetImmediateStructuralPostDominator(edge.second);
        }
        /// calculate back edges.
        CFA<BasicBlock>::DepthFirstTraversal(
            function.pseudo_entry_block(),
            function.AugmentedStructuralCFGSuccessorsFunction(), ignore_block,
            ignore_block,
            [&](const BasicBlock* from, const BasicBlock* to) {
              // A back edge must be a real edge. Since the augmented successors
              // contain structural edges, filter those from consideration.
              for (const auto* succ : *(from->successors())) {
                if (succ == to) back_edges.emplace_back(from->id(), to->id());
              }
            },
            no_terminal_blocks);
      }
      UpdateContinueConstructExitBlocks(function, back_edges);

      if (auto error =
              StructuredControlFlowChecks(_, &function, back_edges, postorder))
        return error;
    }
  }

  if (auto error = MaximalReconvergenceChecks(_)) {
    return error;
  }

  return SPV_SUCCESS;
}